

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.h
# Opt level: O1

void __thiscall
filtered_directed_graph_t::filtered_directed_graph_t
          (filtered_directed_graph_t *this,filtered_directed_graph_t *big_graph,
          unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
          *subset)

{
  vertex_index_t v_00;
  ulong uVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  mapped_type *pmVar6;
  ulong uVar7;
  ushort uVar8;
  ulong uVar9;
  int iVar10;
  __node_base_ptr p_Var11;
  unsigned_long uVar12;
  unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
  *__range1;
  unsigned_short v;
  unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
  vertex_indices;
  uint local_a8;
  ushort local_a2;
  filtered_directed_graph_t *local_a0;
  ulong local_98;
  _Hash_node_base *local_90;
  filtered_directed_graph_t *local_88;
  vector<float,_std::allocator<float>_> local_80;
  _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_68._M_buckets = (__buckets_ptr)((ulong)local_68._M_buckets & 0xffffffff00000000);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_80,(subset->_M_h)._M_element_count,(value_type_conflict2 *)&local_68,
             (allocator_type *)&local_a8);
  local_a0 = this;
  filtered_directed_graph_t(this,&local_80,(big_graph->super_directed_graph_t).directed);
  if (local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  p_Var3 = (subset->_M_h)._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    iVar10 = 0;
    do {
      local_a8 = iVar10 << 0x10 | (uint)*(ushort *)&p_Var3[1]._M_nxt;
      std::
      _Hashtable<unsigned_short,std::pair<unsigned_short_const,unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_short>>,std::__detail::_Select1st,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<unsigned_short,unsigned_short>>
                ((_Hashtable<unsigned_short,std::pair<unsigned_short_const,unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_short>>,std::__detail::_Select1st,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&local_68,&local_a8);
      iVar10 = iVar10 + 1;
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  p_Var3 = (subset->_M_h)._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    local_88 = big_graph;
    do {
      local_a8 = CONCAT22(local_a8._2_2_,*(undefined2 *)&p_Var3[1]._M_nxt);
      uVar4 = (big_graph->super_directed_graph_t).incidence_row_length;
      local_90 = p_Var3;
      if (uVar4 != 0) {
        uVar7 = 0;
        do {
          uVar12 = (big_graph->super_directed_graph_t).incidence_outgoing.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[(ushort)local_a8 * uVar4 + uVar7];
          local_98 = uVar7;
          if (uVar12 != 0) {
            do {
              uVar4 = 0;
              if (uVar12 != 0) {
                for (; (uVar12 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                }
              }
              uVar9 = uVar4 | uVar7 << 6;
              uVar8 = (ushort)uVar9;
              uVar1 = (subset->_M_h)._M_bucket_count;
              uVar9 = (uVar9 & 0xffff) % uVar1;
              p_Var2 = (subset->_M_h)._M_buckets[uVar9 & 0xffffffff];
              p_Var5 = (__node_base_ptr)0x0;
              if ((p_Var2 != (__node_base_ptr)0x0) &&
                 (p_Var5 = p_Var2, p_Var11 = p_Var2->_M_nxt,
                 *(ushort *)&p_Var2->_M_nxt[1]._M_nxt != uVar8)) {
                while (p_Var3 = p_Var11->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
                  p_Var5 = (__node_base_ptr)0x0;
                  if (((ulong)*(ushort *)&p_Var3[1]._M_nxt % uVar1 != uVar9) ||
                     (p_Var5 = p_Var11, p_Var11 = p_Var3, *(ushort *)&p_Var3[1]._M_nxt == uVar8))
                  goto LAB_001344fb;
                }
                p_Var5 = (__node_base_ptr)0x0;
              }
LAB_001344fb:
              if ((p_Var5 != (__node_base_ptr)0x0) && (p_Var5->_M_nxt != (_Hash_node_base *)0x0)) {
                pmVar6 = std::__detail::
                         _Map_base<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&local_68,(key_type *)&local_a8);
                v_00 = *pmVar6;
                local_a2 = uVar8;
                pmVar6 = std::__detail::
                         _Map_base<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&local_68,&local_a2);
                add_filtered_edge(local_a0,v_00,*pmVar6,0.0);
              }
              uVar12 = uVar12 & ~(1L << (uVar4 & 0x3f));
            } while (uVar12 != 0);
          }
          uVar7 = local_98 + 1;
          uVar4 = (local_88->super_directed_graph_t).incidence_row_length;
          big_graph = local_88;
        } while (uVar7 < uVar4);
      }
      p_Var3 = local_90->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

filtered_directed_graph_t(filtered_directed_graph_t* big_graph, std::unordered_set<vertex_index_t> subset)
	    : filtered_directed_graph_t(std::vector<value_t>(subset.size(), 0), big_graph->directed) {
		// Add the edges
		std::unordered_map<vertex_index_t, vertex_index_t> vertex_indices;
		vertex_index_t index = 0;
		for (auto v : subset) vertex_indices.insert(std::make_pair(v, index++));

		for (auto v : subset) {
			// Check intersections in chunks of 64
			for (size_t offset = 0; offset < big_graph->incidence_row_length; offset++) {
				auto bits = big_graph->get_outgoing_chunk(v, offset);
				size_t vertex_offset = offset << 6;

				while (bits > 0) {
					// Get the least significant non-zero bit
					auto b = __builtin_ctzl(bits);

					// Unset this bit
					bits &= ~(ONE_ << b);

					if (subset.find(vertex_index_t(vertex_offset + b)) != subset.end())
						add_filtered_edge(vertex_indices[v], vertex_indices[vertex_index_t(vertex_offset + b)], 0);
				}
			}
		}
	}